

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

size_t testing::internal::GetThreadCount(void)

{
  undefined8 uVar1;
  __pid_t _Var2;
  int iVar3;
  stringstream *local_278;
  ifstream file;
  size_type *local_70;
  string dummy;
  string filename;
  
  Message::Message((Message *)&local_278);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278->field_0x10,"/proc/",6);
  _Var2 = getpid();
  std::ostream::operator<<(&local_278->field_0x10,_Var2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278->field_0x10,"/stat",5);
  StringStreamToString((string *)((long)&dummy.field_2 + 8),local_278);
  if (local_278 != (stringstream *)0x0) {
    (**(code **)(*(long *)local_278 + 8))();
  }
  dummy._M_dataplus._M_p = (pointer)0x0;
  dummy._M_string_length._0_1_ = 0;
  local_70 = &dummy._M_string_length;
  std::ifstream::ifstream(&local_278,(char *)dummy.field_2._8_8_,_S_in);
  iVar3 = -0x14;
  while (iVar3 = iVar3 + 1, iVar3 != 0) {
    std::operator>>((istream *)&local_278,(string *)&local_70);
  }
  filename.field_2._8_8_ = 0;
  std::istream::_M_extract<unsigned_long>((ulong *)&local_278);
  uVar1 = filename.field_2._8_8_;
  std::ifstream::~ifstream(&local_278);
  if (local_70 != &dummy._M_string_length) {
    operator_delete(local_70,CONCAT71(dummy._M_string_length._1_7_,
                                      (undefined1)dummy._M_string_length) + 1);
  }
  if ((size_type *)dummy.field_2._8_8_ != &filename._M_string_length) {
    operator_delete((void *)dummy.field_2._8_8_,filename._M_string_length + 1);
  }
  return uVar1;
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<size_t>(filename, 19);
}